

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::SwizzleOp::SwizzleOp(SwizzleOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRange *this_00;
  int iVar1;
  int iVar2;
  int elemNdx;
  long lVar3;
  int inElemNdx;
  ExecValueStorage *local_70;
  ValueRange *local_68;
  set<int,_std::less<int>,_std::allocator<int>_> availableElements;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__SwizzleOp_01e728d0;
  this_00 = &this->m_outValueRange;
  ValueRange::ValueRange(this_00,valueRange);
  this->m_numInputElements = 0;
  local_70 = &this->m_value;
  this->m_child = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = this_00;
  ValueStorage<64>::setStorage(local_70,&this_00->m_type);
  iVar1 = (this->m_outValueRange).m_type.m_numElements;
  iVar2 = 2;
  if (2 < iVar1) {
    iVar2 = iVar1;
  }
  iVar2 = de::Random::getInt(state->m_random,iVar2,4);
  this->m_numInputElements = iVar2;
  availableElements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &availableElements._M_t._M_impl.super__Rb_tree_header._M_header;
  availableElements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  availableElements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  availableElements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  availableElements._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       availableElements._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (inElemNdx = 0; inElemNdx < iVar2; inElemNdx = inElemNdx + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &availableElements,&inElemNdx);
    iVar2 = this->m_numInputElements;
  }
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    if (lVar3 < iVar1) {
      inElemNdx = de::Random::choose<int,std::_Rb_tree_const_iterator<int>>
                            (state->m_random,
                             (_Rb_tree_const_iterator<int>)
                             availableElements._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                             (_Rb_tree_const_iterator<int>)
                             &availableElements._M_t._M_impl.super__Rb_tree_header);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (&availableElements._M_t,&inElemNdx);
      this->m_swizzle[lVar3] = (deUint8)inElemNdx;
    }
    else {
      this->m_swizzle[lVar3] = '\0';
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&availableElements._M_t);
  return;
}

Assistant:

SwizzleOp::SwizzleOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_outValueRange		(valueRange)
	, m_numInputElements	(0)
	, m_child				(DE_NULL)
{
	DE_ASSERT(!m_outValueRange.getType().isVoid()); // \todo [2011-06-13 pyry] Void support
	DE_ASSERT(m_outValueRange.getType().isFloatOrVec()	||
			  m_outValueRange.getType().isIntOrVec()	||
			  m_outValueRange.getType().isBoolOrVec());

	m_value.setStorage(m_outValueRange.getType());

	int numOutputElements	= m_outValueRange.getType().getNumElements();

	// \note Swizzle works for vector types only.
	// \todo [2011-06-13 pyry] Use components multiple times.
	m_numInputElements		= state.getRandom().getInt(deMax32(numOutputElements, 2), 4);

	std::set<int> availableElements;
	for (int ndx = 0; ndx < m_numInputElements; ndx++)
		availableElements.insert(ndx);

	// Randomize swizzle.
	for (int elemNdx = 0; elemNdx < (int)DE_LENGTH_OF_ARRAY(m_swizzle); elemNdx++)
	{
		if (elemNdx < numOutputElements)
		{
			int inElemNdx = state.getRandom().choose<int>(availableElements.begin(), availableElements.end());
			availableElements.erase(inElemNdx);
			m_swizzle[elemNdx] = (deUint8)inElemNdx;
		}
		else
			m_swizzle[elemNdx] = 0;
	}
}